

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::PushParserState(AsciiParser *this)

{
  size_type sVar1;
  uint64_t uVar2;
  ostream *poVar3;
  ParseState local_1c0;
  ParseState state;
  uint64_t loc;
  ostringstream local_190 [8];
  ostringstream ss_e;
  AsciiParser *this_local;
  
  sVar1 = ::std::
          stack<tinyusdz::ascii::AsciiParser::ParseState,_std::deque<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>_>
          ::size(&this->parse_stack);
  uVar2 = StreamReader::size(this->_sr);
  if (sVar1 < uVar2) {
    state.loc = StreamReader::tell(this->_sr);
    ParseState::ParseState(&local_1c0);
    local_1c0.loc = state.loc;
    ::std::
    stack<tinyusdz::ascii::AsciiParser::ParseState,_std::deque<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>_>
    ::push(&this->parse_stack,&local_1c0);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_190);
    poVar3 = ::std::operator<<((ostream *)local_190,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,"[ASCII]");
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"PushParserState");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x841);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_190,"Parser state stack become too deep.");
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&loc);
    ::std::__cxx11::string::~string((string *)&loc);
    ::std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return sVar1 < uVar2;
}

Assistant:

bool AsciiParser::PushParserState() {
  // Stack size must be less than the number of input bytes.
  if (parse_stack.size() >= _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Parser state stack become too deep.");
  }

  uint64_t loc = _sr->tell();

  ParseState state;
  state.loc = int64_t(loc);
  parse_stack.push(state);

  return true;
}